

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.hpp
# Opt level: O3

type __thiscall
jsoncons::detail::to_integer_unchecked<long,char>(detail *this,char *s,size_t length,long *n)

{
  detail *pdVar1;
  detail dVar2;
  assertion_error *this_00;
  undefined4 uVar3;
  long lVar4;
  type tVar5;
  string local_38;
  
  if (s == (char *)0x0) {
    this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"assertion \'length > 0\' failed at  <> :0","");
    assertion_error::assertion_error(this_00,&local_38);
    __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined8 *)length = 0;
  pdVar1 = this + (long)s;
  if (*this == (detail)0x2d) {
    this = this + 1;
    if (1 < (long)s) {
      lVar4 = 0;
      do {
        n = (long *)CONCAT71((int7)((ulong)n >> 8),1);
        uVar3 = SUB84(n,0);
        if (lVar4 < -0xccccccccccccccc) goto LAB_001ee0b6;
        dVar2 = *this;
        lVar4 = lVar4 * 10;
        *(long *)length = lVar4;
        if (lVar4 < (long)(char)dVar2 + 0x7fffffffffffffd0) goto LAB_001ee0b6;
        lVar4 = (lVar4 - (char)dVar2) + 0x30;
        *(long *)length = lVar4;
        this = this + 1;
      } while (this < pdVar1);
    }
  }
  else if (0 < (long)s) {
    lVar4 = 0;
    do {
      n = (long *)CONCAT71((int7)((ulong)n >> 8),1);
      uVar3 = SUB84(n,0);
      if (0xccccccccccccccc < lVar4) goto LAB_001ee0b6;
      dVar2 = *this;
      lVar4 = lVar4 * 10;
      *(long *)length = lVar4;
      if (-0x7fffffffffffffd1 - (long)(char)dVar2 < lVar4) goto LAB_001ee0b6;
      lVar4 = (long)(char)dVar2 + -0x30 + lVar4;
      *(long *)length = lVar4;
      this = this + 1;
    } while (this < pdVar1);
  }
  uVar3 = 0;
LAB_001ee0b6:
  tVar5._8_4_ = uVar3;
  tVar5.ptr = (char *)this;
  tVar5._12_4_ = 0;
  return tVar5;
}

Assistant:

typename std::enable_if<ext_traits::integer_limits<T>::is_specialized && ext_traits::integer_limits<T>::is_signed,to_integer_result<T,CharT>>::type
to_integer_unchecked(const CharT* s, std::size_t length, T& n)
{
    static_assert(ext_traits::integer_limits<T>::is_specialized, "Integer type not specialized");
    JSONCONS_ASSERT(length > 0);

    n = 0;

    const CharT* end = s + length; 
    if (*s == '-')
    {
        static constexpr T min_value = (ext_traits::integer_limits<T>::lowest)();
        static constexpr T min_value_div_10 = min_value / 10;
        ++s;
        for (; s < end; ++s)
        {
            T x = (T)*s - (T)('0');
            if (n < min_value_div_10)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }
            n = n * 10;
            if (n < min_value + x)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }

            n -= x;
        }
    }
    else
    {
        static constexpr T max_value = (ext_traits::integer_limits<T>::max)();
        static constexpr T max_value_div_10 = max_value / 10;
        for (; s < end; ++s)
        {
            T x = static_cast<T>(*s) - static_cast<T>('0');
            if (n > max_value_div_10)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }
            n = n * 10;
            if (n > max_value - x)
            {
                return to_integer_result<T,CharT>(s, to_integer_errc::overflow);
            }

            n += x;
        }
    }

    return to_integer_result<T,CharT>(s, to_integer_errc());
}